

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O0

void __thiscall Spc_Dsp::set_output(Spc_Dsp *this,sample_t_conflict1 *out,int size)

{
  int size_local;
  sample_t_conflict1 *out_local;
  Spc_Dsp *this_local;
  
  size_local = size;
  out_local = out;
  if (out == (sample_t_conflict1 *)0x0) {
    out_local = (this->m).extra;
    size_local = 0x10;
  }
  (this->m).out_begin = out_local;
  (this->m).out = out_local;
  (this->m).out_end = out_local + size_local;
  return;
}

Assistant:

void Spc_Dsp::set_output( sample_t* out, int size )
{
	require( (size & 1) == 0 ); // must be even
	if ( !out )
	{
		out  = m.extra;
		size = extra_size;
	}
	m.out_begin = out;
	m.out       = out;
	m.out_end   = out + size;
}